

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::RegAlloc(LinearScan *this)

{
  Type *ppAVar1;
  undefined1 *puVar2;
  IRKind IVar3;
  uint uVar4;
  JitArenaAllocator *this_00;
  ScriptContextInfo *pSVar5;
  char16 *pcVar6;
  GeneratorBailInInstr *this_01;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  code *pcVar8;
  undefined8 allocator;
  bool bVar9;
  bool bVar10;
  OpCode OVar11;
  BOOL BVar12;
  uint32 uVar13;
  uint uVar14;
  uint uVar15;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar16;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *pSVar18;
  LoweredBasicBlock *pLVar19;
  undefined4 *puVar20;
  char *dataBlock;
  GlobalBailOutRecordDataTable **ppGVar21;
  JITTimeFunctionBody *pJVar22;
  FunctionJITTimeInfo *pFVar23;
  Instr *pIVar24;
  BailOutInfo *pBVar25;
  GeneratorBailInInstr *pGVar26;
  Func *pFVar27;
  Type pAVar28;
  uint uVar29;
  GeneratorBailInInstr *bailInInstr;
  uint **__s;
  ulong uVar30;
  size_t requestedBytes;
  undefined1 local_160 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  SCCLiveness liveness;
  undefined1 local_50 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_160,
             L"BE-LinearScan",
             (this->func->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  tempAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->tempAlloc = (JitArenaAllocator *)local_160;
  pSVar16 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3eba5c);
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar16;
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar16->allocator = (Type)local_160;
  this->opHelperSpilledLiveranges = pSVar16;
  pSVar16 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3eba5c);
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar16;
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar16->allocator = (Type)local_160;
  this->activeLiveranges = pSVar16;
  pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,(JitArenaAllocator *)local_160,0x3eba5c);
  pBVar17->head = (Type_conflict)0x0;
  pBVar17->lastFoundIndex = (Type_conflict)0x0;
  pBVar17->alloc = (JitArenaAllocator *)local_160;
  pBVar17->lastUsedNodePrevNextField = (Type)pBVar17;
  this->liveOnBackEdgeSyms = pBVar17;
  pSVar16 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3eba5c);
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar16;
  (pSVar16->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar16->allocator = (Type)local_160;
  this->stackPackInUseLiveRanges = pSVar16;
  pSVar18 = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3eba5c);
  (pSVar18->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar18;
  (pSVar18->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar18->allocator = (Type)local_160;
  this->stackSlotsFreeList = pSVar18;
  pLVar19 = (LoweredBasicBlock *)
            new<Memory::JitArenaAllocator>(0x98,(JitArenaAllocator *)local_160,0x3eba5c);
  LoweredBasicBlock::LoweredBasicBlock(pLVar19,(JitArenaAllocator *)local_160);
  this->currentBlock = pLVar19;
  bailInInstr = (GeneratorBailInInstr *)this->func->m_headInstr;
  SCCLiveness::SCCLiveness
            ((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList,this->func,this->tempAlloc
            );
  local_50 = (undefined1  [8])this->func;
  __autoCodeGen.func._0_4_ = 0xe6;
  Func::BeginPhase((Func *)local_50,LivenessPhase);
  SCCLiveness::Build((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_50,this->func,LivenessPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_50);
  this->lifetimeList =
       (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&liveness.extendedLifetimesLoopList;
  ppAVar1 = &liveness.lifetimeList.allocator;
  this->opHelperBlockList = (SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  (this->opHelperBlockIter).list =
       (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  pAVar28 = (Type)0x0;
  if (liveness.lifetimeList.allocator != (Type)ppAVar1) {
    pAVar28 = liveness.lifetimeList.allocator;
  }
  (this->opHelperBlockIter).current = (NodeBase *)pAVar28;
  Init(this);
  pFVar27 = this->func;
  __autoCodeGen._8_8_ = &pFVar27->topFunc->nativeCodeDataAllocator;
  if ((pFVar27->field_0x240 & 0x10) != 0) {
    uVar13 = pFVar27->m_inlineeId;
    BVar12 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar20 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar9) goto LAB_0057b207;
      *puVar20 = 0;
    }
    dataBlock = NativeCodeData::Allocator::AllocZero
                          ((Allocator *)__autoCodeGen._8_8_,(ulong)(uVar13 + 1) << 3);
    ppGVar21 = (GlobalBailOutRecordDataTable **)
               NativeCodeData::AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>::
               AddFixup((AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_> *)
                        __autoCodeGen._8_8_,dataBlock);
    if (ppGVar21 == (GlobalBailOutRecordDataTable **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar20 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar9) goto LAB_0057b207;
      *puVar20 = 0;
    }
    this->globalBailOutRecordTables = ppGVar21;
    __s = (uint **)&DAT_00000008;
    uVar29 = this->func->m_inlineeId + 1;
    if (uVar29 != 0) {
      this_00 = this->tempAlloc;
      BVar12 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar12 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar20 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar9) goto LAB_0057b207;
        *puVar20 = 0;
      }
      uVar30 = (ulong)uVar29;
      requestedBytes = uVar30 * 8;
      __s = (uint **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)this_00,requestedBytes);
      memset(__s,0,requestedBytes);
      memset(__s + uVar30,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar30 * -8);
      if (__s == (uint **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar20 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar9) goto LAB_0057b207;
        *puVar20 = 0;
        __s = (uint **)0x0;
      }
    }
    this->lastUpdatedRowIndices = __s;
    if (DAT_015b0943 == '\x01') {
      pSVar5 = this->func->m_scriptContextInfo;
      uVar29 = this->func->m_inlineeId + 1;
      pSVar5[0x11f]._vptr_ScriptContextInfo = pSVar5[0x11f]._vptr_ScriptContextInfo + uVar29;
      pSVar5[0x120]._vptr_ScriptContextInfo = pSVar5[0x120]._vptr_ScriptContextInfo + uVar29;
    }
  }
  this->m_bailOutRecordCount = 0;
  if (bailInInstr != (GeneratorBailInInstr *)0x0) {
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar9 = true;
    liveness._112_8_ = &DAT_015b6718;
    do {
      pGVar26 = (GeneratorBailInInstr *)(bailInInstr->super_LabelInstr).super_Instr.m_next;
      uVar13 = IR::Instr::GetNumber((Instr *)bailInInstr);
      if (uVar13 == 0) {
        bVar10 = LowererMD::IsAssign((Instr *)bailInInstr);
        if (!bVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar20 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0x9b,"(LowererMD::IsAssign(instr))","Only expect spill code here");
          if (!bVar10) goto LAB_0057b207;
          *puVar20 = 0;
        }
      }
      else {
        pJVar22 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
        pFVar23 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
        bVar10 = Js::Phases::IsEnabled((Phases *)liveness._112_8_,LinearScanPhase,uVar14,uVar15);
        if (bVar10) {
          IR::Instr::Dump((Instr *)bailInInstr);
        }
        this->currentInstr = (Instr *)bailInInstr;
        IVar3 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
        if (((IVar3 < 7) && ((0x68U >> (IVar3 & 0x1f) & 1) != 0)) || (bVar9)) {
          this->currentBlockNumber = this->currentBlockNumber + 1;
        }
        if (IVar3 == InstrKindBranch) {
          BVar12 = Func::HasTry(this->func);
          if ((BVar12 != 0) && (bVar9 = Func::DoOptimizeTry(this->func), bVar9)) {
            ProcessEHRegionBoundary(this,(Instr *)bailInInstr);
          }
          if (this->loopNest == 0) goto LAB_0057ac42;
          uVar13 = IR::Instr::GetNumber((Instr *)bailInInstr);
          bVar9 = (this->curLoop->regAlloc).loopEnd <= uVar13;
        }
        else {
          if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) {
            this->lastLabel = &bailInInstr->super_LabelInstr;
            if ((bailInInstr->super_LabelInstr).m_loweredBasicBlock == (LoweredBasicBlock *)0x0) {
              if ((0 < (this->currentBlock->inlineeFrameLifetimes).
                       super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                       count) ||
                 (0 < (this->currentBlock->inlineeStack).
                      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count))
              {
                pIVar24 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)bailInInstr);
                if (pIVar24 == (Instr *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar20 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                     ,0xbf,"(prevInstr)","prevInstr");
                  if (!bVar9) goto LAB_0057b207;
                  *puVar20 = 0;
                }
                if (pIVar24->m_kind == InstrKindBranch) {
                  OVar11 = pIVar24->m_opcode;
                  if (OVar11 < ADD) {
                    if ((OVar11 != Br) && (OVar11 != MultiBr)) goto LAB_0057ae4e;
                  }
                  else {
                    bVar9 = LowererMD::IsUnconditionalBranch(pIVar24);
                    if (!bVar9) goto LAB_0057ae4e;
                  }
                }
                else {
LAB_0057ae4e:
                  bVar9 = OpCodeAttr::HasFallThrough(pIVar24->m_opcode);
                  if (bVar9) goto LAB_0057ac2d;
                }
                pLVar19 = (LoweredBasicBlock *)
                          new<Memory::JitArenaAllocator>
                                    (0x98,(JitArenaAllocator *)local_160,0x3eba5c);
                LoweredBasicBlock::LoweredBasicBlock(pLVar19,(JitArenaAllocator *)local_160);
                goto LAB_0057ac26;
              }
            }
            else {
              pIVar24 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)bailInInstr);
              if (pIVar24 == (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar20 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0xb4,"(prevInstr)","prevInstr");
                if (!bVar9) goto LAB_0057b207;
                *puVar20 = 0;
              }
              if (pIVar24->m_kind == InstrKindBranch) {
                OVar11 = pIVar24->m_opcode;
                if (OVar11 < ADD) {
                  if ((OVar11 != Br) && (OVar11 != MultiBr)) goto LAB_0057abf7;
                }
                else {
                  bVar9 = LowererMD::IsUnconditionalBranch(pIVar24);
                  if (!bVar9) goto LAB_0057abf7;
                }
              }
              else {
LAB_0057abf7:
                bVar9 = OpCodeAttr::HasFallThrough(pIVar24->m_opcode);
                if (bVar9) {
                  Memory::
                  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,LoweredBasicBlock>
                            ((AllocatorType *)local_160,this->currentBlock);
                }
              }
              pLVar19 = this->lastLabel->m_loweredBasicBlock;
LAB_0057ac26:
              this->currentBlock = pLVar19;
            }
LAB_0057ac2d:
            this->currentRegion = this->lastLabel->m_region;
          }
LAB_0057ac42:
          bVar9 = false;
        }
        bVar10 = RemoveDeadStores(this,(Instr *)bailInInstr);
        if (bVar10) {
          bVar9 = false;
        }
        else {
          if ((((bailInInstr->super_LabelInstr).super_Instr.field_0x38 & 0x10) != 0) &&
             (pBVar25 = IR::Instr::GetBailOutInfo((Instr *)bailInInstr),
             pBVar25->bailOutRecord == (BailOutRecord *)0x0)) {
            if (DAT_0159ef89 == '\x01') {
              pcVar6 = (bailInInstr->super_LabelInstr).super_Instr.globOptInstrString;
              this_01 = bailInInstr;
              while (pcVar6 == (char16 *)0x0) {
                this_01 = (GeneratorBailInInstr *)(this_01->super_LabelInstr).super_Instr.m_prev;
                pcVar6 = (this_01->super_LabelInstr).super_Instr.globOptInstrString;
              }
              IR::Instr::Dump((Instr *)bailInInstr);
              IR::Instr::DumpGlobOptInstrString((Instr *)this_01);
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar20 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                ,0xeb,"(false)","Lazy bailout: bailOutRecord not allocated");
            if (!bVar10) goto LAB_0057b207;
            *puVar20 = 0;
          }
          if ((((bailInInstr->super_LabelInstr).super_Instr.field_0x38 & 0x10) != 0) &&
             (bVar10 = IR::Instr::HasLazyBailOut((Instr *)bailInInstr), !bVar10)) {
            if ((this->currentRegion != (Region *)0x0) &&
               ((byte)(this->currentRegion->type - RegionTypeTry) < 3)) {
              puVar2 = &this->func->field_0x240;
              *(uint *)puVar2 = *(uint *)puVar2 | 0x20;
            }
            FillBailOutRecord(this,(Instr *)bailInInstr);
          }
          SetSrcRegs(this,(Instr *)bailInInstr);
          EndDeadLifetimes(this,(Instr *)bailInInstr,bVar9);
          if ((bailInInstr->super_LabelInstr).super_Instr.m_kind == InstrKindBranch) {
            ProcessSecondChanceBoundary(this,(BranchInstr *)bailInInstr);
          }
          CheckIfInLoop(this,(Instr *)bailInInstr);
          if (bVar9 != false) {
            EndDeadLifetimes(this,(Instr *)bailInInstr,false);
          }
          CheckOpHelper(this,(Instr *)bailInInstr);
          KillImplicitRegs(this,(Instr *)bailInInstr);
          ProcessLazyBailOut(this,(Instr *)bailInInstr);
          AllocateNewLifetimes(this,(Instr *)bailInInstr);
          SetDstReg(this,(Instr *)bailInInstr);
          EndDeadOpHelperLifetimes(this,(Instr *)bailInInstr);
          IVar3 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
          if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) {
            ProcessSecondChanceBoundary(this,&bailInInstr->super_LabelInstr);
          }
          CheckInvariants(this);
          IVar3 = (bailInInstr->super_LabelInstr).super_Instr.m_kind;
          if ((((IVar3 == InstrKindBranch) || (IVar3 == InstrKindExit)) ||
              (OVar11 = (bailInInstr->super_LabelInstr).super_Instr.m_opcode, OVar11 - 0x23 < 3)) ||
             (OVar11 - 0x173 < 2)) {
            OVar11 = (bailInInstr->super_LabelInstr).super_Instr.m_opcode;
            bVar9 = true;
          }
          else {
            bVar9 = false;
          }
          if (OVar11 == GeneratorBailInLabel) {
            pGVar26 = (GeneratorBailInInstr *)
                      GeneratorBailIn::GenerateBailIn(&this->bailIn,bailInInstr);
          }
        }
      }
      bailInInstr = pGVar26;
    } while (pGVar26 != (GeneratorBailInInstr *)0x0);
  }
  allocator = __autoCodeGen._8_8_;
  pFVar27 = this->func;
  if ((pFVar27->field_0x240 & 0x10) != 0) {
    uVar29 = 0;
    do {
      if (this->globalBailOutRecordTables[uVar29] != (GlobalBailOutRecordDataTable *)0x0) {
        GlobalBailOutRecordDataTable::Finalize
                  (this->globalBailOutRecordTables[uVar29],(Allocator *)allocator,
                   (JitArenaAllocator *)local_160);
        pFVar27 = this->func;
        if (DAT_015b0943 == '\x01') {
          pSVar5 = pFVar27->m_scriptContextInfo;
          uVar4 = this->globalBailOutRecordTables[uVar29]->length;
          pSVar5[0x11f]._vptr_ScriptContextInfo =
               pSVar5[0x11f]._vptr_ScriptContextInfo + (ulong)uVar4 * 2;
          pSVar5[0x120]._vptr_ScriptContextInfo =
               pSVar5[0x120]._vptr_ScriptContextInfo + (ulong)uVar4 * 2;
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 <= pFVar27->m_inlineeId);
  }
  if (this->floatRegUsedCount + this->intRegUsedCount != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar20 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13b,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func))"
                       ,"RegUsedCount is wrong");
    if (!bVar9) goto LAB_0057b207;
    *puVar20 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->activeLiveranges->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->activeLiveranges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar20 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13c,"(this->activeLiveranges->Empty())","Active list not empty");
    if (!bVar9) goto LAB_0057b207;
    *puVar20 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->stackPackInUseLiveRanges->
      super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->stackPackInUseLiveRanges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar20 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13d,"(this->stackPackInUseLiveRanges->Empty())","Spilled list not empty");
    if (!bVar9) goto LAB_0057b207;
    *puVar20 = 0;
  }
  pSVar7 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
           (this->opHelperBlockIter).current;
  if ((pSVar7 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar7 != (this->opHelperBlockIter).list)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar20 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13f,"(!this->opHelperBlockIter.IsValid())",
                       "Got to the end with a helper block still on the list?");
    if (!bVar9) goto LAB_0057b207;
    *puVar20 = 0;
  }
  if ((this->currentBlock->inlineeStack).
      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar20 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x141,"(this->currentBlock->inlineeStack.Count() == 0)",
                       "this->currentBlock->inlineeStack.Count() == 0");
    if (!bVar9) {
LAB_0057b207:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar20 = 0;
  }
  LinearScanMD::InsertOpHelperSpillAndRestores(&this->linearScanMD,this->opHelperBlockList);
  pJVar22 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
  pFVar23 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b3868,LinearScanPhase,uVar14,uVar15);
  if (bVar9) {
    PrintStats(this);
  }
  pJVar22 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
  pFVar23 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,StackPackPhase,uVar14,uVar15);
  if (bVar9) {
    Output::Print(L"---------------------------\n");
  }
  this->func->allowRemoveBailOutArgInstr = true;
  SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
             &liveness.lifetimeList.allocator);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             &liveness.extendedLifetimesLoopList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_160);
  return;
}

Assistant:

void
LinearScan::RegAlloc()
{
    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LinearScan"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->tempAlloc = &tempAlloc;
    this->opHelperSpilledLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->activeLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->liveOnBackEdgeSyms = JitAnew(&tempAlloc, BVSparse<JitArenaAllocator>, &tempAlloc);
    this->stackPackInUseLiveRanges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->stackSlotsFreeList = JitAnew(&tempAlloc, SList<StackSlot *>, &tempAlloc);
    this->currentBlock = LoweredBasicBlock::New(&tempAlloc);

    IR::Instr *currentInstr = this->func->m_headInstr;

    SCCLiveness liveness(this->func, this->tempAlloc);
    BEGIN_CODEGEN_PHASE(this->func, Js::LivenessPhase);

    // Build the lifetime list
    liveness.Build();
    END_CODEGEN_PHASE(this->func, Js::LivenessPhase);


    this->lifetimeList = &liveness.lifetimeList;

    this->opHelperBlockList = &liveness.opHelperBlockList;
    this->opHelperBlockIter = SList<OpHelperBlock>::Iterator(this->opHelperBlockList);
    this->opHelperBlockIter.Next();

    this->Init();

    NativeCodeData::Allocator * nativeAllocator = this->func->GetNativeCodeDataAllocator();
    if (func->hasBailout)
    {
        this->globalBailOutRecordTables = NativeCodeDataNewArrayZ(nativeAllocator, GlobalBailOutRecordDataTable *,  func->m_inlineeId + 1);
        this->lastUpdatedRowIndices = JitAnewArrayZ(this->tempAlloc, uint *, func->m_inlineeId + 1);

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            this->func->GetScriptContext()->bailOutOffsetBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
            this->func->GetScriptContext()->bailOutRecordBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
        }
#endif
    }

    m_bailOutRecordCount = 0;
    bool endOfBasicBlock = true;
    FOREACH_INSTR_EDITING(instr, instrNext, currentInstr)
    {
        if (instr->GetNumber() == 0)
        {
            AssertMsg(LowererMD::IsAssign(instr), "Only expect spill code here");
            continue;
        }

#if DBG_DUMP && defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            instr->Dump();
        }
#endif // DBG

        this->currentInstr = instr;
        if (instr->StartsBasicBlock() || endOfBasicBlock)
        {
            endOfBasicBlock = false;
            ++currentBlockNumber;
        }

        bool isLoopBackEdge = false;
        if (instr->IsLabelInstr())
        {
            this->lastLabel = instr->AsLabelInstr();
            if (this->lastLabel->m_loweredBasicBlock)
            {
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (prevInstr->HasFallThrough())
                {
                    this->currentBlock->Delete(&tempAlloc);
                }
                this->currentBlock = this->lastLabel->m_loweredBasicBlock;
            }
            else if (currentBlock->HasData())
            {
                // Check if the previous block has fall-through. If so, retain the block info. If not, create empty info.
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (!prevInstr->HasFallThrough())
                {
                    currentBlock = LoweredBasicBlock::New(&tempAlloc);
                }
            }
            this->currentRegion = this->lastLabel->GetRegion();
        }
        else if (instr->IsBranchInstr())
        {
            if (this->func->HasTry() && this->func->DoOptimizeTry())
            {
                this->ProcessEHRegionBoundary(instr);
            }

            isLoopBackEdge = this->IsInLoop() && instr->GetNumber() >= this->curLoop->regAlloc.loopEnd;
        }

        if (this->RemoveDeadStores(instr))
        {
            continue;
        }

#if DBG
        // Since not all call instructions are forwarded to ChangeToHelperCall, we might have
        // missed allocating bailout records for them. Additionally, some instructions might
        // end up being lowered differently, so the lazy bailout is not on a CALL instruction
        // anymore. Use this opportunity to detect them.
        // Note that the dump for the instruction will also be printed with -ForcePostLowerGlobOptInstrString
        if (instr->HasBailOutInfo() && instr->GetBailOutInfo()->bailOutRecord == nullptr)
        {
            if (CONFIG_FLAG(ForcePostLowerGlobOptInstrString))
            {
                // The instruction has already been lowered, find the start to get the globopt dump
                IR::Instr *curr = instr;
                while (curr->globOptInstrString == nullptr)
                {
                    curr = curr->m_prev;
                }

                instr->Dump();
                curr->DumpGlobOptInstrString();
            }

            AssertMsg(false, "Lazy bailout: bailOutRecord not allocated");
        }
#endif

        if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
        {
            if (this->currentRegion)
            {
                RegionType curRegType = this->currentRegion->GetType();
                if (curRegType == RegionTypeTry || curRegType == RegionTypeCatch || curRegType == RegionTypeFinally)
                {
                    this->func->hasBailoutInEHRegion = true;
                }
            }

            this->FillBailOutRecord(instr);
        }

        this->SetSrcRegs(instr);
        this->EndDeadLifetimes(instr, isLoopBackEdge);

        if (instr->IsBranchInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsBranchInstr());
        }
        this->CheckIfInLoop(instr);
        if (isLoopBackEdge)
        {
            this->EndDeadLifetimes(instr, false);
        }

        this->CheckOpHelper(instr);

        this->KillImplicitRegs(instr);

        this->ProcessLazyBailOut(instr);

        this->AllocateNewLifetimes(instr);
        this->SetDstReg(instr);

        this->EndDeadOpHelperLifetimes(instr);

        if (instr->IsLabelInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsLabelInstr());
        }

#if DBG
        this->CheckInvariants();
#endif // DBG

        if(instr->EndsBasicBlock())
        {
            endOfBasicBlock = true;
        }

        if (instr->IsGeneratorBailInInstr())
        {
            instrNext = this->bailIn.GenerateBailIn(instr->AsGeneratorBailInInstr());
        }
    } NEXT_INSTR_EDITING;

    if (func->hasBailout)
    {
        for (uint i = 0; i <= func->m_inlineeId; i++)
        {
            if (globalBailOutRecordTables[i] != nullptr)
            {
                globalBailOutRecordTables[i]->Finalize(nativeAllocator, &tempAlloc);
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
                if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
                {
                    func->GetScriptContext()->bailOutOffsetBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                    func->GetScriptContext()->bailOutRecordBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                }
#endif
            }
        }
    }

    AssertMsg((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func) , "RegUsedCount is wrong");
    AssertMsg(this->activeLiveranges->Empty(), "Active list not empty");
    AssertMsg(this->stackPackInUseLiveRanges->Empty(), "Spilled list not empty");

    AssertMsg(!this->opHelperBlockIter.IsValid(), "Got to the end with a helper block still on the list?");

    Assert(this->currentBlock->inlineeStack.Count() == 0);
    this->InsertOpHelperSpillAndRestores();

#if _M_IX86
# if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.Instrument.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(),this->func->GetLocalFunctionId()))
    {
        this->DynamicStatsInstrument();
    }
# endif
#endif

#if DBG_DUMP
    if (PHASE_STATS(Js::LinearScanPhase, this->func))
    {
        this->PrintStats();
    }
    if (PHASE_TRACE(Js::StackPackPhase, this->func))
    {
        Output::Print(_u("---------------------------\n"));
    }
#endif // DBG_DUMP
    DebugOnly(this->func->allowRemoveBailOutArgInstr = true);
}